

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

string * __thiscall
Node::OutputForcedType_abi_cxx11_(string *__return_storage_ptr__,Node *this,VARTYPE VarType)

{
  VARTYPE VVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  VVar1 = GetNodeVarType(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x203) {
    NoParen_abi_cxx11_(&local_d0,this);
LAB_0011a030:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
    local_40._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
    _Var7._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0011a2f1;
  }
  if (VarType == VARTYPE_INTEGER) {
    if (VVar1 - VARTYPE_BYTE < 4) {
LAB_0011a023:
      NoParen_abi_cxx11_(&local_d0,this);
      goto LAB_0011a030;
    }
  }
  else if (VVar1 == VarType) goto LAB_0011a023;
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"(","");
  OutputVarType_abi_cxx11_(&local_70,VarType);
  uVar6 = 0xf;
  if (local_50 != &local_40) {
    uVar6 = local_40._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_70._M_string_length + local_48) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar6 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_70._M_string_length + local_48) goto LAB_0011a00c;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_0011a00c:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  }
  local_110 = &local_100;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_100 = *plVar3;
    uStack_f8 = puVar2[3];
  }
  else {
    local_100 = *plVar3;
    local_110 = (long *)*puVar2;
  }
  local_108 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar4 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar4) {
    local_a0 = *puVar4;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar4;
    local_b0 = (ulong *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)puVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  NoParen_abi_cxx11_(&local_90,this);
  uVar5 = 0xf;
  if (local_b0 != &local_a0) {
    uVar5 = local_a0;
  }
  if (uVar5 < local_90._M_string_length + local_a8) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar6 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_90._M_string_length + local_a8) goto LAB_0011a16c;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0011a16c:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
  }
  local_f0 = &local_e0;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_e0 = *plVar3;
    uStack_d8 = puVar2[3];
  }
  else {
    local_e0 = *plVar3;
    local_f0 = (long *)*puVar2;
  }
  local_e8 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar4 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4) {
    local_d0.field_2._M_allocated_capacity = *puVar4;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar4;
    local_d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d0._M_string_length = plVar3[1];
  *plVar3 = (long)puVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Var7._M_p = (pointer)local_50;
  if (local_50 == &local_40) {
    return __return_storage_ptr__;
  }
LAB_0011a2f1:
  operator_delete(_Var7._M_p,local_40._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputForcedType(
	VARTYPE VarType		/**< Variable type */
)
{
	int ThisType = GetNodeVarType();	// Var type of this node
	int NeedForce = 0;			// Do we need to force the type
	std::string result;

	//
	// A NULL will match anything
	//
	if (Type == BAS_N_NULL)
	{
		result = NoParen();
		return result;
//		return 0;
	}

	//
	// Determine if we really need to force
	//
	switch(VarType)
	{
	case VARTYPE_INTEGER:
		//
		// Integer type allows for BYTE, INTEGER, LONG
		//
		if ((ThisType != VARTYPE_BYTE) &&
			(ThisType != VARTYPE_WORD) &&
			(ThisType != VARTYPE_INTEGER) &&
			(ThisType != VARTYPE_LONG))
		{
			NeedForce = 1;
		}
		break;

	default:
		if (ThisType != VarType)
		{
			NeedForce = 1;
		}
	}

	//
	// Now force out the proper code
	//
	if (NeedForce)
	{
		result = std::string("(") + OutputVarType(VarType) + ")(" +
			NoParen() + ")";
	}
	else
	{
		result = NoParen();
	}

	return result;
}